

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

bool __thiscall Graph<Node>::operator==(Graph<Node> *this,Graph<Node> *other)

{
  Edge *pEVar1;
  Edge *pEVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  vector<Edge> v;
  vector<Edge> local_28;
  
  vector<Edge>::operator=(&local_28,&this->edges);
  pEVar2 = local_28.vect;
  uVar3 = (ulong)local_28._size;
  if (uVar3 != 0) {
    pEVar1 = local_28.vect + uVar3;
    lVar5 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::__introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_28.vect,pEVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(pEVar2,pEVar1);
  }
  if ((long)local_28._size < 1) {
    bVar4 = true;
  }
  else {
    pEVar2 = (other->edges).vect;
    bVar4 = true;
    lVar5 = 4;
    uVar3 = 1;
    do {
      bVar6 = *(int *)((long)&pEVar2->_nodeS + lVar5) ==
              *(int *)((long)&(local_28.vect)->_nodeS + lVar5) &&
              *(int *)((long)local_28.vect + lVar5 + -4) == *(int *)((long)pEVar2 + lVar5 + -4);
      if (bVar4 < bVar6) {
        bVar6 = bVar4;
      }
      bVar4 = bVar6;
      if ((ulong)(long)local_28._size <= uVar3) break;
      lVar5 = lVar5 + 0xc;
      uVar3 = uVar3 + 1;
    } while (bVar4 != false);
  }
  if (local_28.vect != (Edge *)0x0) {
    operator_delete__(&local_28.vect[-1]._nodeD);
  }
  return bVar4;
}

Assistant:

bool operator == (const Graph &other) const {
        vector <Edge> v = edges;
        std::sort(v.begin(), v.end());
//        v.mergeSort(0, v.size() - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        bool areEqual = true;
        for (int i = 0; i < v.size() and areEqual; ++i) {
            areEqual = min(areEqual, v[i] == other.getEdge(i));
        }

        return areEqual;
    }